

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CropResizeLayerParams::SerializeWithCachedSizes
          (CropResizeLayerParams *this,CodedOutputStream *output)

{
  float value;
  byte *pbVar1;
  bool bVar2;
  unsigned_long *puVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  ulong value_00;
  ulong uVar8;
  int index;
  uint value_01;
  
  if (0 < (this->targetsize_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    value_01 = this->_targetsize_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_01);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar6 = pbVar1;
      uVar7 = value_01;
      if (0x7f < value_01) {
        do {
          *pbVar6 = (byte)value_01 | 0x80;
          uVar7 = value_01 >> 7;
          pbVar6 = pbVar6 + 1;
          bVar2 = 0x3fff < value_01;
          value_01 = uVar7;
        } while (bVar2);
      }
      *pbVar6 = (byte)uVar7;
      iVar4 = ((int)pbVar6 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
  }
  iVar4 = (this->targetsize_).current_size_;
  if (0 < iVar4) {
    index = 0;
    do {
      puVar3 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->targetsize_,index);
      value_00 = *puVar3;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value_00);
      }
      else {
        pbVar1 = output->buffer_;
        pbVar6 = pbVar1;
        uVar8 = value_00;
        if (0x7f < value_00) {
          do {
            *pbVar6 = (byte)value_00 | 0x80;
            uVar8 = value_00 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar2 = 0x3fff < value_00;
            value_00 = uVar8;
          } while (bVar2);
        }
        *pbVar6 = (byte)uVar8;
        iVar5 = ((int)pbVar6 - (int)pbVar1) + 1;
        output->buffer_ = output->buffer_ + iVar5;
        output->buffer_size_ = output->buffer_size_ - iVar5;
      }
      index = index + 1;
    } while (index != iVar4);
  }
  if (this->normalizedcoordinates_ != false) {
    google::protobuf::internal::WireFormatLite::WriteBool(2,true,output);
  }
  if (this->mode_ != (SamplingMode *)0x0 &&
      this != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->mode_->super_MessageLite,output);
  }
  if (this->boxindicesmode_ != (BoxCoordinatesMode *)0x0 &&
      this != (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&this->boxindicesmode_->super_MessageLite,output);
  }
  value = this->spatialscale_;
  if ((value == 0.0) && (!NAN(value))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteFloat(5,value,output);
  return;
}

Assistant:

void CropResizeLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CropResizeLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 targetSize = 1;
  if (this->targetsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_targetsize_cached_byte_size_);
  }
  for (int i = 0, n = this->targetsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->targetsize(i), output);
  }

  // bool normalizedCoordinates = 2;
  if (this->normalizedcoordinates() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->normalizedcoordinates(), output);
  }

  // .CoreML.Specification.SamplingMode mode = 3;
  if (this->has_mode()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->mode_, output);
  }

  // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
  if (this->has_boxindicesmode()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *this->boxindicesmode_, output);
  }

  // float spatialScale = 5;
  if (this->spatialscale() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(5, this->spatialscale(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CropResizeLayerParams)
}